

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

int64_t gguf_find_key(gguf_context *ctx,char *key)

{
  int iVar1;
  int64_t iVar2;
  char *__s2;
  gguf_context *in_RSI;
  int64_t i;
  int64_t n_kv;
  int64_t keyfound;
  int64_t in_stack_ffffffffffffffc8;
  gguf_context *__s1;
  long local_28;
  
  iVar2 = gguf_get_n_kv((gguf_context *)0x18ecc1);
  local_28 = 0;
  while( true ) {
    if (iVar2 <= local_28) {
      return -1;
    }
    __s1 = in_RSI;
    __s2 = gguf_get_key(in_RSI,in_stack_ffffffffffffffc8);
    iVar1 = strcmp((char *)__s1,__s2);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

int64_t gguf_find_key(const struct gguf_context * ctx, const char * key) {
    // return -1 if key not found
    int64_t keyfound = -1;

    const int64_t n_kv = gguf_get_n_kv(ctx);

    for (int64_t i = 0; i < n_kv; ++i) {
        if (strcmp(key, gguf_get_key(ctx, i)) == 0) {
            keyfound = i;
            break;
        }
    }

    return keyfound;
}